

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O3

target_ulong_conflict
helper_extp_mips(target_ulong_conflict ac,target_ulong_conflict size,CPUMIPSState_conflict *env)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  target_ulong_conflict dspc;
  target_ulong_conflict tVar5;
  
  uVar1 = (env->active_tc).DSPControl;
  bVar2 = (byte)(size & 0x1f);
  if ((uVar1 & 0x3f) < (size & 0x1f)) {
    tVar5 = uVar1 | 0x4000;
    uVar3 = 0;
  }
  else {
    bVar4 = bVar2 ^ 0x1f;
    uVar3 = (uint)((int)(CONCAT44((env->active_tc).HI[ac],(env->active_tc).LO[ac]) >>
                        ((char)(uVar1 & 0x3f) - bVar2 & 0x3f)) << bVar4) >> bVar4;
    tVar5 = uVar1 & 0xffffbfff;
  }
  (env->active_tc).DSPControl = tVar5;
  return uVar3;
}

Assistant:

target_ulong helper_extp(target_ulong ac, target_ulong size, CPUMIPSState *env)
{
    int32_t start_pos;
    int sub;
    uint32_t temp;
    uint64_t acc;

    size = size & 0x1F;

    temp = 0;
    start_pos = get_DSPControl_pos(env);
    sub = start_pos - (size + 1);
    if (sub >= -1) {
        acc = ((uint64_t)env->active_tc.HI[ac] << 32) |
              ((uint64_t)env->active_tc.LO[ac] & MIPSDSP_LLO);
        temp = (acc >> (start_pos - size)) & (~0U >> (31 - size));
        set_DSPControl_efi(0, env);
    } else {
        set_DSPControl_efi(1, env);
    }

    return (target_ulong)temp;
}